

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O2

void duckdb::ListValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  PhysicalType PVar2;
  data_ptr_t pdVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer pVVar7;
  reference pvVar8;
  Vector *pVVar9;
  long lVar10;
  LogicalType *target_type;
  idx_t iVar11;
  ulong uVar12;
  size_type sVar13;
  Vector *target;
  Vector *source;
  reference pvVar14;
  pointer pVVar15;
  idx_t i;
  ulong uVar16;
  ulong uVar17;
  idx_t c;
  long lVar18;
  idx_t c_3;
  data_ptr_t pdVar19;
  data_ptr_t pdVar20;
  size_type __n;
  idx_t c_2;
  idx_t iVar21;
  long lVar22;
  size_type sVar23;
  idx_t r;
  idx_t c_11;
  string_t sVar24;
  data_ptr_t local_140;
  long local_138;
  long local_120;
  Value val;
  idx_t offset_sum;
  long local_80;
  vector<unsigned_long,_true> col_offsets;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  pVVar15 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar7 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar7 == pVVar15) {
    pdVar3 = result->data;
    pdVar3[0] = '\0';
    pdVar3[1] = '\0';
    pdVar3[2] = '\0';
    pdVar3[3] = '\0';
    pdVar3[4] = '\0';
    pdVar3[5] = '\0';
    pdVar3[6] = '\0';
    pdVar3[7] = '\0';
    pdVar3[8] = '\0';
    pdVar3[9] = '\0';
    pdVar3[10] = '\0';
    pdVar3[0xb] = '\0';
    pdVar3[0xc] = '\0';
    pdVar3[0xd] = '\0';
    pdVar3[0xe] = '\0';
    pdVar3[0xf] = '\0';
    return;
  }
  for (uVar16 = 0; uVar16 < (ulong)(((long)pVVar7 - (long)pVVar15) / 0x68); uVar16 = uVar16 + 1) {
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar16);
    if (pvVar8->vector_type != CONSTANT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
    }
    pVVar15 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar7 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pVVar9 = ListVector::GetEntry(result);
  PVar2 = (pVVar9->type).physical_type_;
  switch(PVar2) {
  case BOOL:
  case INT8:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    pdVar20 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    iVar11 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      iVar21 = iVar11;
      lVar18 = lVar10;
      while (bVar6 = lVar18 != 0, lVar18 = lVar18 + -1, bVar6) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          pdVar20[iVar21] = *(data_t *)(lVar4 + uVar17);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,iVar21);
        }
        iVar21 = iVar21 + 1;
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      iVar11 = iVar11 + lVar10;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case UINT8:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    pdVar20 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    iVar11 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      iVar21 = iVar11;
      lVar18 = lVar10;
      while (bVar6 = lVar18 != 0, lVar18 = lVar18 + -1, bVar6) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          pdVar20[iVar21] = *(data_t *)(lVar4 + uVar17);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,iVar21);
        }
        iVar21 = iVar21 + 1;
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      iVar11 = iVar11 + lVar10;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case UINT16:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined2 *)(local_140 + lVar18 * 2) = *(undefined2 *)(lVar4 + uVar17 * 2);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 2;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case INT16:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined2 *)(local_140 + lVar18 * 2) = *(undefined2 *)(lVar4 + uVar17 * 2);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 2;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case UINT32:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined4 *)(local_140 + lVar18 * 4) = *(undefined4 *)(lVar4 + uVar17 * 4);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 4;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case INT32:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined4 *)(local_140 + lVar18 * 4) = *(undefined4 *)(lVar4 + uVar17 * 4);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 4;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case UINT64:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined8 *)(local_140 + lVar18 * 8) = *(undefined8 *)(lVar4 + uVar17 * 8);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 8;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case INT64:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined8 *)(local_140 + lVar18 * 8) = *(undefined8 *)(lVar4 + uVar17 * 8);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 8;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
switchD_01e09dbf_caseD_a:
    target_type = ListType::GetChildType(&result->type);
    pdVar3 = result->data;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      iVar11 = ListVector::GetListSize(result);
      *(idx_t *)(pdVar3 + uVar16 * 0x10) = iVar11;
      for (uVar17 = 0;
          uVar12 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                          .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start) / 0x68, uVar17 < uVar12;
          uVar17 = uVar17 + 1) {
        DataChunk::GetValue((Value *)&col_offsets,args,uVar17,uVar16);
        Value::DefaultCastAs(&val,(Value *)&col_offsets,target_type,false);
        Value::~Value((Value *)&col_offsets);
        ListVector::PushBack(result,&val);
        Value::~Value(&val);
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10 + 8) = uVar12;
    }
    return;
  case FLOAT:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined4 *)(local_140 + lVar18 * 4) = *(undefined4 *)(lVar4 + uVar17 * 4);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 4;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case DOUBLE:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    local_140 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          *(undefined8 *)(local_140 + lVar18 * 8) = *(undefined8 *)(lVar4 + uVar17 * 8);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      local_140 = local_140 + lVar10 * 8;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case INTERVAL:
    lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * lVar10);
    pdVar3 = result->data;
    pVVar9 = ListVector::GetEntry(result);
    pdVar20 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    local_138 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar22 = 0x10;
      pdVar19 = pdVar20;
      for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
        lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
        uVar17 = uVar16;
        if (lVar4 != 0) {
          uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
        }
        lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),uVar17
                          );
        if (bVar6) {
          puVar1 = (undefined8 *)(lVar4 + uVar17 * 0x10);
          uVar5 = puVar1[1];
          *(undefined8 *)pdVar19 = *puVar1;
          *(undefined8 *)(pdVar19 + 8) = uVar5;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_138 + lVar18);
        }
        pdVar19 = pdVar19 + 0x10;
        lVar22 = lVar22 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
      *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
      local_138 = local_138 + lVar10;
      pdVar20 = pdVar20 + lVar10 * 0x10;
    }
    ListVector::SetListSize(result,args->count * lVar10);
    break;
  case LIST:
    sVar13 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
    ListVector::Reserve(result,args->count * sVar13);
    col_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    col_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    col_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    offset_sum = 0;
    for (sVar23 = 0; sVar13 != sVar23; sVar23 = sVar23 + 1) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&col_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 &offset_sum);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar23);
      iVar11 = ListVector::GetListSize(pvVar8);
      offset_sum = offset_sum + iVar11;
    }
    pVVar9 = ListVector::GetEntry(result);
    ListVector::Reserve(pVVar9,offset_sum);
    target = ListVector::GetEntry(pVVar9);
    for (sVar23 = 0; sVar13 != sVar23; sVar23 = sVar23 + 1) {
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar23);
      Vector::Vector((Vector *)&val,pvVar8);
      iVar11 = ListVector::GetListSize((Vector *)&val);
      if (iVar11 != 0) {
        source = ListVector::GetEntry((Vector *)&val);
        pvVar14 = vector<unsigned_long,_true>::get<true>(&col_offsets,sVar23);
        VectorOperations::Copy(source,target,iVar11,0,*pvVar14);
      }
      Vector::~Vector((Vector *)&val);
    }
    pdVar3 = result->data;
    pdVar20 = pVVar9->data;
    FlatVector::VerifyFlatVector(pVVar9);
    DataChunk::ToUnifiedFormat((DataChunk *)&val);
    pdVar20 = pdVar20 + 8;
    local_80 = sVar13 << 4;
    local_120 = 0;
    for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
      lVar10 = 0x10;
      local_140 = pdVar20;
      for (__n = 0; sVar13 != __n; __n = __n + 1) {
        lVar22 = **(long **)(val.type_._0_8_ + -0x10 + lVar10);
        uVar17 = uVar16;
        if (lVar22 != 0) {
          uVar17 = (ulong)*(uint *)(lVar22 + uVar16 * 4);
        }
        lVar22 = *(long *)(val.type_._0_8_ + -8 + lVar10);
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar10),uVar17
                          );
        if (bVar6) {
          uVar5 = *(undefined8 *)(lVar22 + 8 + uVar17 * 0x10);
          pvVar14 = vector<unsigned_long,_true>::get<true>(&col_offsets,__n);
          *(value_type *)(local_140 + -8) = *(long *)(lVar22 + uVar17 * 0x10) + *pvVar14;
          *(undefined8 *)local_140 = uVar5;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,local_120 + __n)
          ;
        }
        local_140 = local_140 + 0x10;
        lVar10 = lVar10 + 0x48;
      }
      *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * sVar13;
      *(size_type *)(pdVar3 + uVar16 * 0x10 + 8) = sVar13;
      local_120 = local_120 + sVar13;
      pdVar20 = pdVar20 + local_80;
    }
    ListVector::SetListSize(result,args->count * sVar13);
    ListVector::SetListSize(pVVar9,offset_sum);
    ::std::
    unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>::
    ~unique_ptr((unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                 *)&val);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&col_offsets);
    return;
  default:
    if (PVar2 == VARCHAR) {
      lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68;
      ListVector::Reserve(result,args->count * lVar10);
      pdVar3 = result->data;
      pVVar9 = ListVector::GetEntry(result);
      pdVar20 = pVVar9->data;
      FlatVector::VerifyFlatVector(pVVar9);
      DataChunk::ToUnifiedFormat((DataChunk *)&val);
      pdVar20 = pdVar20 + 8;
      local_138 = 0;
      for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
        lVar22 = 0x10;
        pdVar19 = pdVar20;
        for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
          lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
          uVar17 = uVar16;
          if (lVar4 != 0) {
            uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
          }
          lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
          bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),
                             uVar17);
          if (bVar6) {
            sVar24 = ListValueStringAssign::Assign<duckdb::string_t>
                               ((string_t *)(lVar4 + uVar17 * 0x10),pVVar9);
            *(long *)(pdVar19 + -8) = sVar24.value._0_8_;
            *(long *)pdVar19 = sVar24.value._8_8_;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                       local_138 + lVar18);
          }
          pdVar19 = pdVar19 + 0x10;
          lVar22 = lVar22 + 0x48;
        }
        *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
        *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
        local_138 = local_138 + lVar10;
        pdVar20 = pdVar20 + lVar10 * 0x10;
      }
      ListVector::SetListSize(result,args->count * lVar10);
    }
    else if (PVar2 == UINT128) {
      lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68;
      ListVector::Reserve(result,args->count * lVar10);
      pdVar3 = result->data;
      pVVar9 = ListVector::GetEntry(result);
      pdVar20 = pVVar9->data;
      FlatVector::VerifyFlatVector(pVVar9);
      DataChunk::ToUnifiedFormat((DataChunk *)&val);
      local_138 = 0;
      for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
        lVar22 = 0x10;
        pdVar19 = pdVar20;
        for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
          lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
          uVar17 = uVar16;
          if (lVar4 != 0) {
            uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
          }
          lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
          bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),
                             uVar17);
          if (bVar6) {
            puVar1 = (undefined8 *)(lVar4 + uVar17 * 0x10);
            uVar5 = puVar1[1];
            *(undefined8 *)pdVar19 = *puVar1;
            *(undefined8 *)(pdVar19 + 8) = uVar5;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                       local_138 + lVar18);
          }
          pdVar19 = pdVar19 + 0x10;
          lVar22 = lVar22 + 0x48;
        }
        *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
        *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
        local_138 = local_138 + lVar10;
        pdVar20 = pdVar20 + lVar10 * 0x10;
      }
      ListVector::SetListSize(result,args->count * lVar10);
    }
    else {
      if (PVar2 != INT128) goto switchD_01e09dbf_caseD_a;
      lVar10 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68;
      ListVector::Reserve(result,args->count * lVar10);
      pdVar3 = result->data;
      pVVar9 = ListVector::GetEntry(result);
      pdVar20 = pVVar9->data;
      FlatVector::VerifyFlatVector(pVVar9);
      DataChunk::ToUnifiedFormat((DataChunk *)&val);
      local_138 = 0;
      for (uVar16 = 0; uVar16 < args->count; uVar16 = uVar16 + 1) {
        lVar22 = 0x10;
        pdVar19 = pdVar20;
        for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
          lVar4 = **(long **)(val.type_._0_8_ + -0x10 + lVar22);
          uVar17 = uVar16;
          if (lVar4 != 0) {
            uVar17 = (ulong)*(uint *)(lVar4 + uVar16 * 4);
          }
          lVar4 = *(long *)(val.type_._0_8_ + -8 + lVar22);
          bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)(val.type_._0_8_ + lVar22),
                             uVar17);
          if (bVar6) {
            puVar1 = (undefined8 *)(lVar4 + uVar17 * 0x10);
            uVar5 = puVar1[1];
            *(undefined8 *)pdVar19 = *puVar1;
            *(undefined8 *)(pdVar19 + 8) = uVar5;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                       local_138 + lVar18);
          }
          pdVar19 = pdVar19 + 0x10;
          lVar22 = lVar22 + 0x48;
        }
        *(ulong *)(pdVar3 + uVar16 * 0x10) = uVar16 * lVar10;
        *(long *)(pdVar3 + uVar16 * 0x10 + 8) = lVar10;
        local_138 = local_138 + lVar10;
        pdVar20 = pdVar20 + lVar10 * 0x10;
      }
      ListVector::SetListSize(result,args->count * lVar10);
    }
  }
  ::std::
  unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>::
  ~unique_ptr((unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               *)&val);
  return;
}

Assistant:

static void ListValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	if (args.ColumnCount() == 0) {
		// no columns - early out - result is a constant empty list
		auto result_data = FlatVector::GetData<list_entry_t>(result);
		result_data[0].length = 0;
		result_data[0].offset = 0;
		return;
	}
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}
	auto &result_type = ListVector::GetEntry(result).GetType();
	switch (result_type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedListValueFunction<int8_t>(args, result);
		break;
	case PhysicalType::INT16:
		TemplatedListValueFunction<int16_t>(args, result);
		break;
	case PhysicalType::INT32:
		TemplatedListValueFunction<int32_t>(args, result);
		break;
	case PhysicalType::INT64:
		TemplatedListValueFunction<int64_t>(args, result);
		break;
	case PhysicalType::UINT8:
		TemplatedListValueFunction<uint8_t>(args, result);
		break;
	case PhysicalType::UINT16:
		TemplatedListValueFunction<uint16_t>(args, result);
		break;
	case PhysicalType::UINT32:
		TemplatedListValueFunction<uint32_t>(args, result);
		break;
	case PhysicalType::UINT64:
		TemplatedListValueFunction<uint64_t>(args, result);
		break;
	case PhysicalType::INT128:
		TemplatedListValueFunction<hugeint_t>(args, result);
		break;
	case PhysicalType::UINT128:
		TemplatedListValueFunction<uhugeint_t>(args, result);
		break;
	case PhysicalType::FLOAT:
		TemplatedListValueFunction<float>(args, result);
		break;
	case PhysicalType::DOUBLE:
		TemplatedListValueFunction<double>(args, result);
		break;
	case PhysicalType::INTERVAL:
		TemplatedListValueFunction<interval_t>(args, result);
		break;
	case PhysicalType::VARCHAR:
		TemplatedListValueFunction<string_t, ListValueStringAssign>(args, result);
		break;
	case PhysicalType::LIST:
		ListValueListFunction(args, result);
		break;
	default: {
		TemplatedListValueFunctionFallback(args, result);
		break;
	}
	}
}